

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint64_t mse_4xh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined1 auVar1 [16];
  uint in_ECX;
  ulong in_RDX;
  ulong uVar2;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar3 [16];
  __m128i v;
  __m128i sum_64x1;
  int i;
  __m128i square_result;
  __m128i zeros;
  __m128i sub_result_16x8;
  __m128i res1_64x2;
  __m128i res0_64x2;
  __m128i res0_32x4;
  __m128i src_16x8;
  __m128i src1_16x4;
  __m128i src0_16x4;
  __m128i dst_16x8;
  __m128i dst1_8x8;
  __m128i dst0_8x8;
  uint64_t sum;
  int local_2dc;
  long local_2d8;
  long lStack_2d0;
  undefined8 local_288;
  undefined8 uStack_280;
  uint64_t local_210 [3];
  int local_1f4;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 local_128 [16];
  uint local_10c;
  undefined1 local_108 [16];
  uint local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  long lStack_30;
  ulong local_28;
  ulong uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_1f4 = (int)in_RSI;
  local_210[0] = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_2d8 = 0;
  lStack_2d0 = 0;
  uVar2 = in_RDX;
  for (local_2dc = 0; local_2dc < in_R8D; local_2dc = local_2dc + 2) {
    local_ec = *(uint *)(in_RDI + local_2dc * local_1f4);
    local_108._4_4_ = 0;
    local_108._0_4_ = local_ec;
    local_10c = *(uint *)(in_RDI + (local_2dc + 1) * local_1f4);
    local_128._4_4_ = 0;
    local_128._0_4_ = local_10c;
    local_b8 = local_108._0_8_;
    uStack_b0 = 0;
    local_c8 = local_128._0_8_;
    uStack_c0 = 0;
    uStack_130 = 0;
    uStack_12c = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_138._0_1_ = (byte)local_ec;
    local_138._1_1_ = (byte)(local_ec >> 8);
    local_138._2_1_ = (byte)(local_ec >> 0x10);
    local_138._3_1_ = (byte)(local_ec >> 0x18);
    uStack_134._0_1_ = (byte)local_10c;
    uStack_134._1_1_ = (byte)(local_10c >> 8);
    uStack_134._2_1_ = (byte)(local_10c >> 0x10);
    uStack_134._3_1_ = (byte)(local_10c >> 0x18);
    local_150 = (undefined8 *)(in_RDX + (long)(int)(local_2dc * in_ECX) * 2);
    local_168 = *local_150;
    uStack_160 = 0;
    uVar2 = (ulong)in_ECX;
    local_170 = (undefined8 *)(in_RDX + (long)(int)((local_2dc + 1) * in_ECX) * 2);
    local_188 = *local_170;
    uStack_180 = 0;
    uStack_90 = 0;
    uStack_a0 = 0;
    local_198._0_2_ = (short)local_168;
    local_198._2_2_ = (short)((ulong)local_168 >> 0x10);
    local_198._4_2_ = (short)((ulong)local_168 >> 0x20);
    local_198._6_2_ = (short)((ulong)local_168 >> 0x30);
    uStack_190._0_2_ = (short)local_188;
    uStack_190._2_2_ = (short)((ulong)local_188 >> 0x10);
    uStack_190._4_2_ = (short)((ulong)local_188 >> 0x20);
    uStack_190._6_2_ = (short)((ulong)local_188 >> 0x30);
    local_1a8._2_2_ = (ushort)local_138._1_1_;
    local_1a8._4_2_ = (ushort)local_138._2_1_;
    local_1a8._6_2_ = (ushort)local_138._3_1_;
    uStack_1a0._2_2_ = (ushort)uStack_134._1_1_;
    uStack_1a0._4_2_ = (ushort)uStack_134._2_1_;
    uStack_1a0._6_2_ = (ushort)uStack_134._3_1_;
    local_1c8 = CONCAT26(local_198._6_2_ - local_1a8._6_2_,
                         CONCAT24(local_198._4_2_ - local_1a8._4_2_,
                                  CONCAT22(local_198._2_2_ - local_1a8._2_2_,
                                           (short)local_198 - (ushort)(byte)local_138)));
    uStack_1c0 = CONCAT26(uStack_190._6_2_ - uStack_1a0._6_2_,
                          CONCAT24(uStack_190._4_2_ - uStack_1a0._4_2_,
                                   CONCAT22(uStack_190._2_2_ - uStack_1a0._2_2_,
                                            (short)uStack_190 - (ushort)(byte)uStack_134)));
    auVar1._8_8_ = uStack_1c0;
    auVar1._0_8_ = local_1c8;
    auVar3._8_8_ = uStack_1c0;
    auVar3._0_8_ = local_1c8;
    auVar3 = pmaddwd(auVar1,auVar3);
    local_288 = auVar3._0_8_;
    uStack_280 = auVar3._8_8_;
    uStack_d0 = uStack_280;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8._0_4_ = auVar3._0_4_;
    local_d8._4_4_ = auVar3._4_4_;
    local_78 = local_288;
    local_88 = 0;
    uStack_80 = 0;
    uStack_70._0_4_ = auVar3._8_4_;
    uStack_70._4_4_ = auVar3._12_4_;
    local_38 = local_2d8;
    lStack_30 = lStack_2d0;
    local_18 = (ulong)(uint)local_d8;
    uStack_10 = (ulong)local_d8._4_4_;
    local_28 = (ulong)(uint)uStack_70;
    uStack_20 = (ulong)uStack_70._4_4_;
    local_48 = local_18 + local_28;
    lStack_40 = uStack_10 + uStack_20;
    local_2d8 = local_2d8 + local_48;
    lStack_2d0 = lStack_2d0 + lStack_40;
    local_1b8 = local_1c8;
    uStack_1b0 = uStack_1c0;
    local_1a8 = (ulong)CONCAT16(local_138._3_1_,
                                (uint6)CONCAT14(local_138._2_1_,
                                                (uint)CONCAT12(local_138._1_1_,
                                                               (ushort)(byte)local_138)));
    uStack_1a0 = (ulong)CONCAT16(uStack_134._3_1_,
                                 (uint6)CONCAT14(uStack_134._2_1_,
                                                 (uint)CONCAT12(uStack_134._1_1_,
                                                                (ushort)(byte)uStack_134)));
    local_198 = local_168;
    uStack_190 = local_188;
    local_138 = local_ec;
    uStack_134 = local_10c;
    local_128 = ZEXT416(local_10c);
    local_108 = ZEXT416(local_ec);
    local_d8 = local_288;
    local_a8 = local_188;
    local_98 = local_168;
    uStack_70 = uStack_280;
  }
  local_58 = local_2d8;
  lStack_50 = lStack_2d0;
  local_68 = lStack_2d0;
  uStack_60 = 0;
  v[1] = uVar2;
  v[0] = in_RSI;
  xx_storel_64(local_210,v);
  return local_210[0];
}

Assistant:

static uint64_t mse_4xh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                   int sstride, int h) {
  uint64_t sum = 0;
  __m128i dst0_8x8, dst1_8x8, dst_16x8;
  __m128i src0_16x4, src1_16x4, src_16x8;
  __m128i res0_32x4, res0_64x2, res1_64x2;
  __m128i sub_result_16x8;
  const __m128i zeros = _mm_setzero_si128();
  __m128i square_result = _mm_setzero_si128();
  for (int i = 0; i < h; i += 2) {
    dst0_8x8 = _mm_cvtsi32_si128(*(int const *)(&dst[(i + 0) * dstride]));
    dst1_8x8 = _mm_cvtsi32_si128(*(int const *)(&dst[(i + 1) * dstride]));
    dst_16x8 = _mm_unpacklo_epi8(_mm_unpacklo_epi32(dst0_8x8, dst1_8x8), zeros);

    src0_16x4 = _mm_loadl_epi64((__m128i const *)(&src[(i + 0) * sstride]));
    src1_16x4 = _mm_loadl_epi64((__m128i const *)(&src[(i + 1) * sstride]));
    src_16x8 = _mm_unpacklo_epi64(src0_16x4, src1_16x4);

    sub_result_16x8 = _mm_sub_epi16(src_16x8, dst_16x8);

    res0_32x4 = _mm_madd_epi16(sub_result_16x8, sub_result_16x8);

    res0_64x2 = _mm_unpacklo_epi32(res0_32x4, zeros);
    res1_64x2 = _mm_unpackhi_epi32(res0_32x4, zeros);

    square_result =
        _mm_add_epi64(square_result, _mm_add_epi64(res0_64x2, res1_64x2));
  }
  const __m128i sum_64x1 =
      _mm_add_epi64(square_result, _mm_srli_si128(square_result, 8));
  xx_storel_64(&sum, sum_64x1);
  return sum;
}